

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void aom_smooth_v_predictor_16x16_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  unkuint9 Var8;
  undefined1 auVar9 [11];
  undefined1 auVar10 [13];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  int y_mask;
  uint uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  short sVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  undefined1 auVar19 [16];
  short sVar34;
  short sVar36;
  undefined1 auVar35 [16];
  ushort uVar37;
  short sVar38;
  ushort uVar39;
  ushort uVar40;
  short sVar42;
  ushort uVar43;
  ushort uVar44;
  short sVar45;
  ushort uVar46;
  ushort uVar47;
  short sVar48;
  ushort uVar49;
  ushort uVar50;
  short sVar51;
  ushort uVar52;
  ushort uVar53;
  short sVar54;
  ushort uVar55;
  ushort uVar56;
  short sVar57;
  ushort uVar58;
  ushort uVar59;
  undefined1 auVar41 [16];
  short sVar60;
  ushort uVar61;
  ushort uVar62;
  
  auVar15 = _DAT_00430350;
  auVar14 = pshuflw(ZEXT116(left_column[0xf]),ZEXT116(left_column[0xf]),0);
  sVar34 = auVar14._0_2_;
  sVar36 = auVar14._2_2_;
  auVar19._2_2_ = sVar36 * 0x1f;
  auVar19._0_2_ = sVar34;
  auVar19._4_2_ = sVar34 * 0x3c;
  auVar19._6_2_ = sVar36 * 0x56;
  auVar19._8_2_ = sVar34 * 0x6f;
  auVar19._10_2_ = sVar36 * 0x85;
  auVar19._12_2_ = sVar34 * 0x9a;
  auVar19._14_2_ = sVar36 * 0xac;
  auVar14 = *(undefined1 (*) [16])top_row;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar14._0_13_;
  auVar1[0xe] = auVar14[7];
  auVar2[0xc] = auVar14[6];
  auVar2._0_12_ = auVar14._0_12_;
  auVar2._13_2_ = auVar1._13_2_;
  auVar3[0xb] = 0;
  auVar3._0_11_ = auVar14._0_11_;
  auVar3._12_3_ = auVar2._12_3_;
  auVar4[10] = auVar14[5];
  auVar4._0_10_ = auVar14._0_10_;
  auVar4._11_4_ = auVar3._11_4_;
  auVar5[9] = 0;
  auVar5._0_9_ = auVar14._0_9_;
  auVar5._10_5_ = auVar4._10_5_;
  auVar6[8] = auVar14[4];
  auVar6._0_8_ = auVar14._0_8_;
  auVar6._9_6_ = auVar5._9_6_;
  auVar7._7_8_ = 0;
  auVar7._0_7_ = auVar6._8_7_;
  Var8 = CONCAT81(SUB158(auVar7 << 0x40,7),auVar14[3]);
  auVar11._9_6_ = 0;
  auVar11._0_9_ = Var8;
  auVar9._1_10_ = SUB1510(auVar11 << 0x30,5);
  auVar9[0] = auVar14[2];
  auVar12._11_4_ = 0;
  auVar12._0_11_ = auVar9;
  auVar10._1_12_ = SUB1512(auVar12 << 0x20,3);
  auVar10[0] = auVar14[1];
  uVar13 = 0x1000100;
  while( true ) {
    auVar41 = _DAT_00430370;
    sVar16 = (short)Var8;
    uVar18 = auVar1._13_2_ >> 8;
    if (0xf0e0f0e < uVar13) break;
    auVar41._4_4_ = uVar13;
    auVar41._0_4_ = uVar13;
    auVar41._8_4_ = uVar13;
    auVar41._12_4_ = uVar13;
    auVar35 = pshufb(auVar15,auVar41);
    auVar41 = pshufb(auVar19,auVar41);
    sVar38 = auVar41._0_2_ + 0x80;
    sVar42 = auVar41._2_2_ + 0x80;
    sVar45 = auVar41._4_2_ + 0x80;
    sVar48 = auVar41._6_2_ + 0x80;
    sVar51 = auVar41._8_2_ + 0x80;
    sVar54 = auVar41._10_2_ + 0x80;
    sVar57 = auVar41._12_2_ + 0x80;
    sVar60 = auVar41._14_2_ + 0x80;
    uVar17 = auVar35._0_2_ * (ushort)auVar14[0] + sVar38;
    uVar20 = auVar35._2_2_ * auVar10._0_2_ + sVar42;
    uVar22 = auVar35._4_2_ * auVar9._0_2_ + sVar45;
    uVar24 = auVar35._6_2_ * sVar16 + sVar48;
    uVar26 = auVar35._8_2_ * auVar6._8_2_ + sVar51;
    uVar28 = auVar35._10_2_ * auVar4._10_2_ + sVar54;
    uVar30 = auVar35._12_2_ * auVar2._12_2_ + sVar57;
    uVar32 = auVar35._14_2_ * uVar18 + sVar60;
    uVar18 = uVar17 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    uVar33 = uVar32 >> 8;
    uVar39 = sVar38 + auVar35._0_2_ * (ushort)auVar14[8];
    uVar43 = sVar42 + auVar35._2_2_ * (ushort)auVar14[9];
    uVar46 = sVar45 + auVar35._4_2_ * (ushort)auVar14[10];
    uVar49 = sVar48 + auVar35._6_2_ * (ushort)auVar14[0xb];
    uVar52 = sVar51 + auVar35._8_2_ * (ushort)auVar14[0xc];
    uVar55 = sVar54 + auVar35._10_2_ * (ushort)auVar14[0xd];
    uVar58 = sVar57 + auVar35._12_2_ * (ushort)auVar14[0xe];
    uVar61 = sVar60 + auVar35._14_2_ * (ushort)auVar14[0xf];
    uVar40 = uVar39 >> 8;
    uVar44 = uVar43 >> 8;
    uVar47 = uVar46 >> 8;
    uVar50 = uVar49 >> 8;
    uVar53 = uVar52 >> 8;
    uVar56 = uVar55 >> 8;
    uVar59 = uVar58 >> 8;
    uVar62 = uVar61 >> 8;
    *dst = (uVar18 != 0) * (uVar18 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar18);
    dst[1] = (uVar21 != 0) * (uVar21 < 0x100) * (char)(uVar20 >> 8) - (0xff < uVar21);
    dst[2] = (uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar22 >> 8) - (0xff < uVar23);
    dst[3] = (uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8) - (0xff < uVar25);
    dst[4] = (uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) - (0xff < uVar27);
    dst[5] = (uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29);
    dst[6] = (uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31);
    dst[7] = (uVar33 != 0) * (uVar33 < 0x100) * (char)(uVar32 >> 8) - (0xff < uVar33);
    dst[8] = (uVar40 != 0) * (uVar40 < 0x100) * (char)(uVar39 >> 8) - (0xff < uVar40);
    dst[9] = (uVar44 != 0) * (uVar44 < 0x100) * (char)(uVar43 >> 8) - (0xff < uVar44);
    dst[10] = (uVar47 != 0) * (uVar47 < 0x100) * (char)(uVar46 >> 8) - (0xff < uVar47);
    dst[0xb] = (uVar50 != 0) * (uVar50 < 0x100) * (char)(uVar49 >> 8) - (0xff < uVar50);
    dst[0xc] = (uVar53 != 0) * (uVar53 < 0x100) * (char)(uVar52 >> 8) - (0xff < uVar53);
    dst[0xd] = (uVar56 != 0) * (uVar56 < 0x100) * (char)(uVar55 >> 8) - (0xff < uVar56);
    dst[0xe] = (uVar59 != 0) * (uVar59 < 0x100) * (char)(uVar58 >> 8) - (0xff < uVar59);
    dst[0xf] = (uVar62 != 0) * (uVar62 < 0x100) * (char)(uVar61 >> 8) - (0xff < uVar62);
    dst = dst + stride;
    uVar13 = uVar13 + 0x2020202;
  }
  auVar15._0_2_ = sVar34 * 0xbc;
  auVar15._2_2_ = sVar36 * 0xca;
  auVar15._4_2_ = sVar34 * 0xd5;
  auVar15._6_2_ = sVar36 * 0xdf;
  auVar15._8_2_ = sVar34 * 0xe6;
  auVar15._10_2_ = sVar36 * 0xec;
  auVar15._12_2_ = sVar34 * 0xef;
  auVar15._14_2_ = sVar36 * 0xf0;
  for (uVar13 = 0x1000100; uVar13 < 0xf0e0f0f; uVar13 = uVar13 + 0x2020202) {
    auVar35._4_4_ = uVar13;
    auVar35._0_4_ = uVar13;
    auVar35._8_4_ = uVar13;
    auVar35._12_4_ = uVar13;
    auVar19 = pshufb(auVar41,auVar35);
    auVar35 = pshufb(auVar15,auVar35);
    sVar34 = auVar35._0_2_ + 0x80;
    sVar36 = auVar35._2_2_ + 0x80;
    sVar38 = auVar35._4_2_ + 0x80;
    sVar42 = auVar35._6_2_ + 0x80;
    sVar45 = auVar35._8_2_ + 0x80;
    sVar48 = auVar35._10_2_ + 0x80;
    sVar51 = auVar35._12_2_ + 0x80;
    sVar54 = auVar35._14_2_ + 0x80;
    uVar17 = auVar19._0_2_ * (ushort)auVar14[0] + sVar34;
    uVar21 = auVar19._2_2_ * auVar10._0_2_ + sVar36;
    uVar23 = auVar19._4_2_ * auVar9._0_2_ + sVar38;
    uVar25 = auVar19._6_2_ * sVar16 + sVar42;
    uVar27 = auVar19._8_2_ * auVar6._8_2_ + sVar45;
    uVar29 = auVar19._10_2_ * auVar4._10_2_ + sVar48;
    uVar31 = auVar19._12_2_ * auVar2._12_2_ + sVar51;
    uVar33 = auVar19._14_2_ * uVar18 + sVar54;
    uVar20 = uVar17 >> 8;
    uVar22 = uVar21 >> 8;
    uVar24 = uVar23 >> 8;
    uVar26 = uVar25 >> 8;
    uVar28 = uVar27 >> 8;
    uVar30 = uVar29 >> 8;
    uVar32 = uVar31 >> 8;
    uVar39 = uVar33 >> 8;
    uVar40 = sVar34 + auVar19._0_2_ * (ushort)auVar14[8];
    uVar44 = sVar36 + auVar19._2_2_ * (ushort)auVar14[9];
    uVar47 = sVar38 + auVar19._4_2_ * (ushort)auVar14[10];
    uVar50 = sVar42 + auVar19._6_2_ * (ushort)auVar14[0xb];
    uVar53 = sVar45 + auVar19._8_2_ * (ushort)auVar14[0xc];
    uVar56 = sVar48 + auVar19._10_2_ * (ushort)auVar14[0xd];
    uVar59 = sVar51 + auVar19._12_2_ * (ushort)auVar14[0xe];
    uVar62 = sVar54 + auVar19._14_2_ * (ushort)auVar14[0xf];
    uVar43 = uVar40 >> 8;
    uVar46 = uVar44 >> 8;
    uVar49 = uVar47 >> 8;
    uVar52 = uVar50 >> 8;
    uVar55 = uVar53 >> 8;
    uVar58 = uVar56 >> 8;
    uVar61 = uVar59 >> 8;
    uVar37 = uVar62 >> 8;
    *dst = (uVar20 != 0) * (uVar20 < 0x100) * (char)(uVar17 >> 8) - (0xff < uVar20);
    dst[1] = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar21 >> 8) - (0xff < uVar22);
    dst[2] = (uVar24 != 0) * (uVar24 < 0x100) * (char)(uVar23 >> 8) - (0xff < uVar24);
    dst[3] = (uVar26 != 0) * (uVar26 < 0x100) * (char)(uVar25 >> 8) - (0xff < uVar26);
    dst[4] = (uVar28 != 0) * (uVar28 < 0x100) * (char)(uVar27 >> 8) - (0xff < uVar28);
    dst[5] = (uVar30 != 0) * (uVar30 < 0x100) * (char)(uVar29 >> 8) - (0xff < uVar30);
    dst[6] = (uVar32 != 0) * (uVar32 < 0x100) * (char)(uVar31 >> 8) - (0xff < uVar32);
    dst[7] = (uVar39 != 0) * (uVar39 < 0x100) * (char)(uVar33 >> 8) - (0xff < uVar39);
    dst[8] = (uVar43 != 0) * (uVar43 < 0x100) * (char)(uVar40 >> 8) - (0xff < uVar43);
    dst[9] = (uVar46 != 0) * (uVar46 < 0x100) * (char)(uVar44 >> 8) - (0xff < uVar46);
    dst[10] = (uVar49 != 0) * (uVar49 < 0x100) * (char)(uVar47 >> 8) - (0xff < uVar49);
    dst[0xb] = (uVar52 != 0) * (uVar52 < 0x100) * (char)(uVar50 >> 8) - (0xff < uVar52);
    dst[0xc] = (uVar55 != 0) * (uVar55 < 0x100) * (char)(uVar53 >> 8) - (0xff < uVar55);
    dst[0xd] = (uVar58 != 0) * (uVar58 < 0x100) * (char)(uVar56 >> 8) - (0xff < uVar58);
    dst[0xe] = (uVar61 != 0) * (uVar61 < 0x100) * (char)(uVar59 >> 8) - (0xff < uVar61);
    dst[0xf] = (uVar37 != 0) * (uVar37 < 0x100) * (char)(uVar62 >> 8) - (0xff < uVar37);
    dst = dst + stride;
  }
  return;
}

Assistant:

void aom_smooth_v_predictor_16x16_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i bottom_left = _mm_set1_epi16(left_column[15]);
  const __m128i zero = _mm_setzero_si128();
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i weights = LoadUnaligned16(smooth_weights + 12);
  const __m128i weights_lo = cvtepu8_epi16(weights);
  const __m128i weights_hi = _mm_unpackhi_epi8(weights, zero);
  const __m128i inverted_weights_lo = _mm_sub_epi16(scale, weights_lo);
  const __m128i inverted_weights_hi = _mm_sub_epi16(scale, weights_hi);
  const __m128i scaled_bottom_left_lo =
      _mm_mullo_epi16(inverted_weights_lo, bottom_left);
  const __m128i scaled_bottom_left_hi =
      _mm_mullo_epi16(inverted_weights_hi, bottom_left);
  const __m128i round = _mm_set1_epi16(128);

  const __m128i top = LoadUnaligned16(top_row);
  const __m128i top_lo = cvtepu8_epi16(top);
  const __m128i top_hi = _mm_unpackhi_epi8(top, zero);
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights_lo, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left_lo, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i weights_y = _mm_shuffle_epi8(weights_hi, y_select);
    const __m128i scaled_bottom_left_y =
        _mm_shuffle_epi8(scaled_bottom_left_hi, y_select);
    write_smooth_directional_sum16(dst, top_lo, top_hi, weights_y, weights_y,
                                   scaled_bottom_left_y, scaled_bottom_left_y,
                                   round);
    dst += stride;
  }
}